

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O1

bool __thiscall MXNetNode::has_weight(MXNetNode *this,int i)

{
  int iVar1;
  pointer piVar2;
  pointer pMVar3;
  pointer pMVar4;
  size_t sVar5;
  size_t __n;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  size_type *psVar9;
  uint uVar10;
  
  if ((i < 0) ||
     (piVar2 = (this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2) >> 2) <= i)) {
    bVar7 = false;
  }
  else {
    pMVar3 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (int)((long)(this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3) *
             -0x45d1745d;
    bVar7 = 0 < (int)uVar10;
    if (0 < (int)uVar10) {
      iVar1 = piVar2[(uint)i];
      pMVar4 = (this->nodes->super__Vector_base<MXNetNode,_std::allocator<MXNetNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = pMVar4[iVar1].name._M_string_length;
      psVar9 = &(pMVar3->name)._M_string_length;
      uVar8 = 0;
      do {
        __n = *psVar9;
        if (__n == sVar5) {
          if (__n == 0) {
            return true;
          }
          iVar6 = bcmp((((string *)(psVar9 + -1))->_M_dataplus)._M_p,
                       pMVar4[iVar1].name._M_dataplus._M_p,__n);
          if (iVar6 == 0) {
            return true;
          }
        }
        uVar8 = uVar8 + 1;
        psVar9 = psVar9 + 0xb;
      } while ((uVar10 & 0x7fffffff) != uVar8);
      bVar7 = uVar8 < (uVar10 & 0x7fffffff);
    }
  }
  return bVar7;
}

Assistant:

bool MXNetNode::has_weight(int i) const
{
    if (i < 0 || i >= (int)weights.size())
        return false;

    const std::string& node_name = (*nodes)[weights[i]].name;

    for (int j = 0; j < (int)(*params).size(); j++)
    {
        const MXNetParam& p = (*params)[j];
        if (p.name == node_name)
            return true;
    }

    return false;
}